

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

void __thiscall
Memory::DefaultRecyclerCollectionWrapper::DisposeObjects
          (DefaultRecyclerCollectionWrapper *this,Recycler *recycler)

{
  bool bVar1;
  DebugCheckNoException local_20;
  DebugCheckNoException __debugCheckNoException;
  Recycler *recycler_local;
  DefaultRecyclerCollectionWrapper *this_local;
  
  __debugCheckNoException = (DebugCheckNoException)recycler;
  bVar1 = IsCollectionDisabled(recycler);
  if (!bVar1) {
    DebugCheckNoException::DebugCheckNoException(&local_20);
    Recycler::DisposeObjects((Recycler *)__debugCheckNoException);
    local_20.hasException = false;
    DebugCheckNoException::~DebugCheckNoException(&local_20);
  }
  return;
}

Assistant:

void
DefaultRecyclerCollectionWrapper::DisposeObjects(Recycler * recycler)
{
    if (IsCollectionDisabled(recycler))
    {
        return;
    }

    BEGIN_NO_EXCEPTION
    {
        recycler->DisposeObjects();
    }